

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * __thiscall
duckdb::Exception::ConstructMessageRecursive<char_const*,int,char_const*>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,char *param,int params,char *params_1)

{
  int iVar1;
  undefined4 in_register_0000008c;
  undefined1 auStack_68 [56];
  
  iVar1 = params;
  ExceptionFormatValue::CreateFormatValue<char_const*>
            ((ExceptionFormatValue *)auStack_68,(ExceptionFormatValue *)values,(char *)msg);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,(ExceptionFormatValue *)auStack_68);
  ::std::__cxx11::string::~string((string *)(auStack_68 + 0x18));
  ConstructMessageRecursive<int,char_const*>
            (__return_storage_ptr__,this,msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             ((ulong)param & 0xffffffff),params,(char *)CONCAT44(in_register_0000008c,iVar1));
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}